

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5FmaPrecision.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)4>::iterate
          (GPUShader5FmaPrecision<(glcts::INPUT_DATA_TYPE)4> *this)

{
  ostringstream *this_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  deRoundingMode mode;
  undefined4 extraout_var;
  void *pvVar5;
  GLfloat *pGVar6;
  TestLog *pTVar7;
  undefined1 *puVar8;
  GLuint j;
  long lVar9;
  char *description;
  GLuint i;
  long lVar10;
  int iVar11;
  GLuint j_1;
  undefined1 *puVar12;
  TestContext *this_01;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  GLfloat *resultsCPU [2];
  GLfloat resultCPURTZ [400];
  GLfloat resultCPURNE [400];
  GLfloat resultFma [400];
  GLfloat resultStd [400];
  TestLog *local_1ac8 [2];
  undefined1 local_1ab8 [120];
  ios_base local_1a40 [264];
  undefined1 local_1938 [1600];
  TestLog local_12f8 [200];
  undefined1 local_cb8 [1600];
  undefined1 local_678 [1608];
  
  initTest(this);
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  lVar10 = 0;
  (**(code **)(lVar9 + 0x30))(0);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glBeginTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x112);
  (**(code **)(lVar9 + 0x538))(0,0,100);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"Rendering failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x115);
  (**(code **)(lVar9 + 0x638))();
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glEndTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x118);
  (**(code **)(lVar9 + 0x40))(0x8c8e,this->m_vbo_result_fma_id);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x120);
  pvVar5 = (void *)(**(code **)(lVar9 + 0xd00))(0x8c8e,0,0x640,1);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"Error mapping buffer object\'s data to client space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x124);
  memcpy(local_cb8,pvVar5,0x640);
  (**(code **)(lVar9 + 0x1670))(0x8c8e);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"Error unmapping buffer object\'s data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x129);
  (**(code **)(lVar9 + 0x40))(0x8c8e,this->m_vbo_result_std_id);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,300);
  pvVar5 = (void *)(**(code **)(lVar9 + 0xd00))(0x8c8e,0,0x640,1);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"Error mapping buffer object\'s data to client space!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x130);
  memcpy(local_678,pvVar5,0x640);
  (**(code **)(lVar9 + 0x1670))(0x8c8e);
  dVar4 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar4,"Error unmapping buffer object\'s data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/gpu_shader5/esextcGPUShader5FmaPrecision.cpp"
                  ,0x135);
  mode = deGetRoundingMode();
  deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
  pGVar6 = this->m_data_c;
  pTVar7 = local_12f8;
  do {
    lVar9 = 0;
    do {
      *(float *)((long)&pTVar7->m_log + lVar9 * 4) =
           pGVar6[lVar9 + -800] * pGVar6[lVar9 + -400] + pGVar6[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    lVar10 = lVar10 + 1;
    pGVar6 = pGVar6 + 4;
    pTVar7 = pTVar7 + 2;
  } while (lVar10 != 100);
  deSetRoundingMode(DE_ROUNDINGMODE_TO_ZERO);
  pGVar6 = this->m_data_c;
  puVar8 = local_1938;
  lVar9 = 0;
  do {
    lVar10 = 0;
    do {
      *(float *)(puVar8 + lVar10 * 4) =
           pGVar6[lVar10 + -800] * pGVar6[lVar10 + -400] + pGVar6[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    lVar9 = lVar9 + 1;
    pGVar6 = pGVar6 + 4;
    puVar8 = puVar8 + 0x10;
  } while (lVar9 != 100);
  deSetRoundingMode(mode);
  local_1ac8[0] = local_12f8;
  local_1ac8[1] = (TestLog *)local_1938;
  lVar9 = 0;
  do {
    pTVar7 = local_1ac8[lVar9];
    bVar2 = true;
    puVar8 = local_cb8;
    lVar10 = 0;
    puVar12 = local_678;
    do {
      bVar16 = false;
      uVar13 = 0;
      do {
        iVar3 = *(int *)((long)&pTVar7->m_log + uVar13 * 4);
        iVar14 = iVar3 - *(int *)(puVar8 + uVar13 * 4);
        iVar1 = -iVar14;
        if (0 < iVar14) {
          iVar1 = iVar14;
        }
        iVar3 = iVar3 - *(int *)(puVar12 + uVar13 * 4);
        iVar14 = -iVar3;
        if (0 < iVar3) {
          iVar14 = iVar3;
        }
        iVar11 = *(int *)(puVar8 + uVar13 * 4) - *(int *)(puVar12 + uVar13 * 4);
        iVar3 = -iVar11;
        if (0 < iVar11) {
          iVar3 = iVar11;
        }
        if ((iVar14 >= 3 || iVar1 >= 3) || 2 < iVar3) {
          bVar16 = true;
        }
      } while (((iVar14 < 3 && iVar1 < 3) && 2 >= iVar3) &&
              (bVar15 = uVar13 < 3, uVar13 = uVar13 + 1, bVar15));
      if (bVar16) break;
      lVar10 = lVar10 + 1;
      pTVar7 = pTVar7 + 2;
      puVar8 = puVar8 + 0x10;
      puVar12 = puVar12 + 0x10;
      bVar2 = false;
    } while (lVar10 != 100);
    if ((!bVar2) || (bVar16 = lVar9 != 0, lVar9 = lVar9 + 1, bVar16)) {
      if (!bVar2) {
        this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        description = "Pass";
      }
      else {
        local_1ab8._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1ab8 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "The values of resultStd[i] & 0xFFFFFFFE and resultFma[i] & 0xFFFFFFFE and resultCPU[i] & 0xFFFFFFFE "
                   ,100);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"are not bitwise equal for i = 0..99\n",0x24);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1ab8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_1a40);
        this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        description = "Fail";
      }
      tcu::TestContext::setTestResult(this_01,(uint)bVar2,description);
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GPUShader5FmaPrecision<S>::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Render */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed");

	gl.drawArrays(GL_POINTS, 0, m_n_elements);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed");

	/* Retrieve the result data */
	glw::GLfloat		resultFma[m_n_elements * S];
	glw::GLfloat		resultStd[m_n_elements * S];
	const glw::GLfloat* resultTmp = DE_NULL;

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_vbo_result_fma_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	resultTmp = (const glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
													   m_n_elements * S * sizeof(glw::GLfloat), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data to client space!");

	memcpy(resultFma, resultTmp, m_n_elements * S * sizeof(glw::GLfloat));

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping buffer object's data!");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_vbo_result_std_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	resultTmp = (const glw::GLfloat*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
													   m_n_elements * S * sizeof(glw::GLfloat), GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error mapping buffer object's data to client space!");

	memcpy(resultStd, resultTmp, m_n_elements * S * sizeof(glw::GLfloat));

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping buffer object's data!");

	/* Execute the algorithm from shader on CPU */
	glw::GLfloat resultCPURNE[m_n_elements * S];
	glw::GLfloat resultCPURTZ[m_n_elements * S];

	deRoundingMode previousRoundingMode = deGetRoundingMode();

	deSetRoundingMode(DE_ROUNDINGMODE_TO_NEAREST_EVEN);
	for (glw::GLuint i = 0; i < m_n_elements; ++i)
	{
		for (glw::GLuint j = 0; j < S; ++j)
		{
			resultCPURNE[i * S + j] = m_data_a[i * S + j] * m_data_b[i * S + j] + m_data_c[i * S + j];
		}
	}

	deSetRoundingMode(DE_ROUNDINGMODE_TO_ZERO);
	for (glw::GLuint i = 0; i < m_n_elements; ++i)
	{
		for (glw::GLuint j = 0; j < S; ++j)
		{
			resultCPURTZ[i * S + j] = m_data_a[i * S + j] * m_data_b[i * S + j] + m_data_c[i * S + j];
		}
	}

	/* Restore the rounding mode so subsequent tests aren't affected */
	deSetRoundingMode(previousRoundingMode);

	/* Check results */
	const glw::GLfloat* resultsCPU[] = { resultCPURNE, resultCPURTZ };
	FloatConverter		cpuU;
	FloatConverter		fmaU;
	FloatConverter		stdU;
	glw::GLboolean		test_failed = true;

	for (glw::GLuint roundingMode = 0; test_failed && roundingMode < 2; ++roundingMode)
	{
		glw::GLboolean rounding_mode_failed = false;
		for (glw::GLuint i = 0; i < m_n_elements; ++i)
		{
			for (int j = 0; j < S; ++j)
			{
				/* Assign float value to the union */
				cpuU.m_float = resultsCPU[roundingMode][i * S + j];
				fmaU.m_float = resultFma[i * S + j];
				stdU.m_float = resultStd[i * S + j];

				/* Convert float to int bitwise */
				glw::GLint cpuTemp = cpuU.m_int;
				glw::GLint fmaTemp = fmaU.m_int;
				glw::GLint stdTemp = stdU.m_int;

				glw::GLboolean diffCpuFma = de::abs(cpuTemp - fmaTemp) > 2;
				glw::GLboolean diffCpuStd = de::abs(cpuTemp - stdTemp) > 2;
				glw::GLboolean diffFmaStd = de::abs(fmaTemp - stdTemp) > 2;

				if (diffCpuFma || diffCpuStd || diffFmaStd)
				{
					rounding_mode_failed = true;
					break;
				}
			}

			if (rounding_mode_failed)
			{
				break;
			}
			else
			{
				test_failed = false;
			}
		} /* for (all elements) */
	}	 /* for (all rounding modes) */

	if (test_failed)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "The values of resultStd[i] & 0xFFFFFFFE and resultFma[i] & 0xFFFFFFFE and resultCPU[i] & 0xFFFFFFFE "
			<< "are not bitwise equal for i = 0..99\n"
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}